

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

void __thiscall
tcmalloc::ThreadCache::ReleaseToCentralCache(ThreadCache *this,FreeList *src,uint32_t cl,int N)

{
  int iVar1;
  size_t sVar2;
  SizeMap *this_00;
  CentralFreeList *pCVar3;
  void *local_60;
  void *head;
  void *tail;
  void *head_1;
  void *tail_1;
  long lStack_38;
  int batch_size;
  size_t delta_bytes;
  int N_local;
  uint32_t cl_local;
  FreeList *src_local;
  ThreadCache *this_local;
  SizeMap *local_10;
  
  delta_bytes._0_4_ = N;
  delta_bytes._4_4_ = cl;
  _N_local = src;
  src_local = this->list_;
  sVar2 = FreeList::length(src);
  if (sVar2 < (ulong)(long)N) {
    sVar2 = FreeList::length(_N_local);
    delta_bytes._0_4_ = (int)sVar2;
  }
  iVar1 = (int)delta_bytes;
  local_10 = Static::sizemap();
  this_local._4_4_ = delta_bytes._4_4_;
  lStack_38 = (long)(iVar1 * local_10->class_to_size_[delta_bytes._4_4_]);
  this_00 = Static::sizemap();
  tail_1._4_4_ = SizeMap::num_objects_to_move(this_00,delta_bytes._4_4_);
  for (; tail_1._4_4_ < (int)delta_bytes; delta_bytes._0_4_ = (int)delta_bytes - tail_1._4_4_) {
    FreeList::PopRange(_N_local,tail_1._4_4_,&tail,&head_1);
    pCVar3 = Static::central_cache();
    CentralFreeList::InsertRange(pCVar3 + delta_bytes._4_4_,tail,head_1,tail_1._4_4_);
  }
  FreeList::PopRange(_N_local,(int)delta_bytes,&local_60,&head);
  pCVar3 = Static::central_cache();
  CentralFreeList::InsertRange(pCVar3 + delta_bytes._4_4_,local_60,head,(int)delta_bytes);
  this->size_ = this->size_ - (int)lStack_38;
  return;
}

Assistant:

void ThreadCache::ReleaseToCentralCache(FreeList* src, uint32_t cl, int N) {
  ASSERT(src == &list_[cl]);
  if (N > src->length()) N = src->length();
  size_t delta_bytes = N * Static::sizemap()->ByteSizeForClass(cl);

  // We return prepackaged chains of the correct size to the central cache.
  // TODO: Use the same format internally in the thread caches?
  int batch_size = Static::sizemap()->num_objects_to_move(cl);
  while (N > batch_size) {
    void *tail, *head;
    src->PopRange(batch_size, &head, &tail);
    Static::central_cache()[cl].InsertRange(head, tail, batch_size);
    N -= batch_size;
  }
  void *tail, *head;
  src->PopRange(N, &head, &tail);
  Static::central_cache()[cl].InsertRange(head, tail, N);
  size_ -= delta_bytes;
}